

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

void __thiscall boost::runtime::param_error::~param_error(param_error *this)

{
  *(undefined ***)this = &PTR__param_error_001e09e0;
  std::__cxx11::string::~string((string *)&this->msg);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

~param_error() BOOST_NOEXCEPT_OR_NOTHROW {}